

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbd.c
# Opt level: O0

PF doscan(KEYMAP *map,int c,KEYMAP **newmap)

{
  bool bVar1;
  PF local_38;
  PF ret;
  map_element *last;
  map_element *elec;
  KEYMAP **newmap_local;
  int c_local;
  KEYMAP *map_local;
  
  last = map->map_element;
  while( true ) {
    bVar1 = false;
    if (last < map->map_element + map->map_num) {
      bVar1 = last->k_num < c;
    }
    if (!bVar1) break;
    last = last + 1;
  }
  ele = last;
  if ((last < map->map_element + map->map_num) && (last->k_base <= c)) {
    local_38 = last->k_funcp[c - last->k_base];
  }
  else {
    local_38 = map->map_default;
  }
  if ((local_38 == (PF)0x0) && (newmap != (KEYMAP **)0x0)) {
    *newmap = last->k_prefmap;
  }
  return local_38;
}

Assistant:

PF
doscan(KEYMAP *map, int c, KEYMAP **newmap)
{
	struct map_element	*elec = &map->map_element[0];
	struct map_element	*last = &map->map_element[map->map_num];
	PF		 ret;

	while (elec < last && c > elec->k_num)
		elec++;

	/* used by prefix and binding code */
	ele = elec;
	if (elec >= last || c < elec->k_base)
		ret = map->map_default;
	else
		ret = elec->k_funcp[c - elec->k_base];
	if (ret == NULL && newmap != NULL)
		*newmap = elec->k_prefmap;

	return (ret);
}